

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parsePrecPrimary(Parser *this)

{
  bool bVar1;
  ParseError *__return_storage_ptr__;
  Parser *in_RSI;
  allocator<char> local_131;
  string local_130;
  undefined1 local_110 [16];
  string local_100;
  undefined1 local_e0 [8];
  undefined1 auStack_d8 [8];
  vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
  elems;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> expr;
  undefined1 local_b0 [32];
  Token paren;
  undefined1 local_60 [16];
  unique_ptr<enact::BooleanExpr,_std::default_delete<enact::BooleanExpr>_> local_50 [2];
  unique_ptr<enact::BooleanExpr,_std::default_delete<enact::BooleanExpr>_> local_40;
  __node_base_ptr local_38;
  unique_ptr<enact::FloatExpr,_std::default_delete<enact::FloatExpr>_> local_30;
  int local_24;
  unique_ptr<enact::IntegerExpr,_std::default_delete<enact::IntegerExpr>_> local_20 [2];
  Parser *this_local;
  
  this_local = this;
  bVar1 = consume(in_RSI,INTEGER);
  if (bVar1) {
    local_24 = std::__cxx11::stoi(&(in_RSI->m_previous).lexeme,(size_t *)0x0,10);
    std::make_unique<enact::IntegerExpr,int>((int *)local_20);
    std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>::
    unique_ptr<enact::IntegerExpr,std::default_delete<enact::IntegerExpr>,void>
              ((unique_ptr<enact::Expr,std::default_delete<enact::Expr>> *)this,local_20);
    std::unique_ptr<enact::IntegerExpr,_std::default_delete<enact::IntegerExpr>_>::~unique_ptr
              (local_20);
  }
  else {
    bVar1 = consume(in_RSI,FLOAT);
    if (bVar1) {
      local_38 = (__node_base_ptr)std::__cxx11::stod(&(in_RSI->m_previous).lexeme,(size_t *)0x0);
      std::make_unique<enact::FloatExpr,double>((double *)&local_30);
      std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>::
      unique_ptr<enact::FloatExpr,std::default_delete<enact::FloatExpr>,void>
                ((unique_ptr<enact::Expr,std::default_delete<enact::Expr>> *)this,&local_30);
      std::unique_ptr<enact::FloatExpr,_std::default_delete<enact::FloatExpr>_>::~unique_ptr
                (&local_30);
    }
    else {
      bVar1 = consume(in_RSI,TRUE);
      if (bVar1) {
        local_50[1]._M_t.
        super___uniq_ptr_impl<enact::BooleanExpr,_std::default_delete<enact::BooleanExpr>_>._M_t.
        super__Tuple_impl<0UL,_enact::BooleanExpr_*,_std::default_delete<enact::BooleanExpr>_>.
        super__Head_base<0UL,_enact::BooleanExpr_*,_false>._M_head_impl._7_1_ = '\x01';
        std::make_unique<enact::BooleanExpr,bool>((bool *)&local_40);
        std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>::
        unique_ptr<enact::BooleanExpr,std::default_delete<enact::BooleanExpr>,void>
                  ((unique_ptr<enact::Expr,std::default_delete<enact::Expr>> *)this,&local_40);
        std::unique_ptr<enact::BooleanExpr,_std::default_delete<enact::BooleanExpr>_>::~unique_ptr
                  (&local_40);
      }
      else {
        bVar1 = consume(in_RSI,FALSE);
        if (bVar1) {
          local_60[0xf] = 0;
          std::make_unique<enact::BooleanExpr,bool>((bool *)(local_60 + 0x10));
          std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>::
          unique_ptr<enact::BooleanExpr,std::default_delete<enact::BooleanExpr>,void>
                    ((unique_ptr<enact::Expr,std::default_delete<enact::Expr>> *)this,
                     (unique_ptr<enact::BooleanExpr,_std::default_delete<enact::BooleanExpr>_> *)
                     (local_60 + 0x10));
          std::unique_ptr<enact::BooleanExpr,_std::default_delete<enact::BooleanExpr>_>::~unique_ptr
                    ((unique_ptr<enact::BooleanExpr,_std::default_delete<enact::BooleanExpr>_> *)
                     (local_60 + 0x10));
        }
        else {
          bVar1 = consume(in_RSI,STRING);
          if (bVar1) {
            std::make_unique<enact::StringExpr,std::__cxx11::string&>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60
                      );
            std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>::
            unique_ptr<enact::StringExpr,std::default_delete<enact::StringExpr>,void>
                      ((unique_ptr<enact::Expr,std::default_delete<enact::Expr>> *)this,
                       (unique_ptr<enact::StringExpr,_std::default_delete<enact::StringExpr>_> *)
                       local_60);
            std::unique_ptr<enact::StringExpr,_std::default_delete<enact::StringExpr>_>::~unique_ptr
                      ((unique_ptr<enact::StringExpr,_std::default_delete<enact::StringExpr>_> *)
                       local_60);
          }
          else {
            bVar1 = consume(in_RSI,INTERPOLATION);
            if (bVar1) {
              parseInterpolationExpr(this);
            }
            else {
              bVar1 = consume(in_RSI,IDENTIFIER);
              if (bVar1) {
                std::make_unique<enact::SymbolExpr,enact::Token&>((Token *)&paren.line);
                std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>::
                unique_ptr<enact::SymbolExpr,std::default_delete<enact::SymbolExpr>,void>
                          ((unique_ptr<enact::Expr,std::default_delete<enact::Expr>> *)this,
                           (unique_ptr<enact::SymbolExpr,_std::default_delete<enact::SymbolExpr>_> *
                           )&paren.line);
                std::unique_ptr<enact::SymbolExpr,_std::default_delete<enact::SymbolExpr>_>::
                ~unique_ptr((unique_ptr<enact::SymbolExpr,_std::default_delete<enact::SymbolExpr>_>
                             *)&paren.line);
              }
              else {
                bVar1 = consume(in_RSI,LEFT_PAREN);
                if (!bVar1) {
                  __return_storage_ptr__ = (ParseError *)__cxa_allocate_exception(0x10);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_130,"Expected expression.",&local_131);
                  errorAtCurrent(__return_storage_ptr__,in_RSI,&local_130);
                  __cxa_throw(__return_storage_ptr__,&ParseError::typeinfo,ParseError::~ParseError);
                }
                Token::Token((Token *)(local_b0 + 0x18),&in_RSI->m_previous);
                bVar1 = consume(in_RSI,RIGHT_PAREN);
                if (bVar1) {
                  std::make_unique<enact::UnitExpr,enact::Token>((Token *)local_b0);
                  std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>::
                  unique_ptr<enact::UnitExpr,std::default_delete<enact::UnitExpr>,void>
                            ((unique_ptr<enact::Expr,std::default_delete<enact::Expr>> *)this,
                             (unique_ptr<enact::UnitExpr,_std::default_delete<enact::UnitExpr>_> *)
                             local_b0);
                  std::unique_ptr<enact::UnitExpr,_std::default_delete<enact::UnitExpr>_>::
                  ~unique_ptr((unique_ptr<enact::UnitExpr,_std::default_delete<enact::UnitExpr>_> *)
                              local_b0);
                }
                else {
                  parseExpr((Parser *)
                            &elems.
                             super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  bVar1 = consume(in_RSI,RIGHT_PAREN);
                  if (bVar1) {
                    std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::unique_ptr
                              ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)this,
                               (unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)
                               &elems.
                                super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  }
                  else {
                    auStack_d8 = (undefined1  [8])0x0;
                    elems.
                    super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    elems.
                    super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    std::
                    vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                    ::vector((vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                              *)auStack_d8);
                    std::
                    vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                    ::push_back((vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                                 *)auStack_d8,
                                (value_type *)
                                &elems.
                                 super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    while( true ) {
                      bVar1 = consume(in_RSI,COMMA);
                      if (!bVar1) break;
                      parseExpr((Parser *)local_e0);
                      std::
                      vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                      ::push_back((vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                                   *)auStack_d8,(value_type *)local_e0);
                      std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::~unique_ptr
                                ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)
                                 local_e0);
                    }
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_100,"Expected \')\' after tuple elements.",
                               (allocator<char> *)(local_110 + 0xf));
                    expect(in_RSI,RIGHT_PAREN,&local_100);
                    std::__cxx11::string::~string((string *)&local_100);
                    std::allocator<char>::~allocator((allocator<char> *)(local_110 + 0xf));
                    std::
                    make_unique<enact::TupleExpr,std::vector<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::allocator<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>>,enact::Token>
                              ((vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                                *)local_110,(Token *)auStack_d8);
                    std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>::
                    unique_ptr<enact::TupleExpr,std::default_delete<enact::TupleExpr>,void>
                              ((unique_ptr<enact::Expr,std::default_delete<enact::Expr>> *)this,
                               (unique_ptr<enact::TupleExpr,_std::default_delete<enact::TupleExpr>_>
                                *)local_110);
                    std::unique_ptr<enact::TupleExpr,_std::default_delete<enact::TupleExpr>_>::
                    ~unique_ptr((unique_ptr<enact::TupleExpr,_std::default_delete<enact::TupleExpr>_>
                                 *)local_110);
                    std::
                    vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                    ::~vector((vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                               *)auStack_d8);
                  }
                  std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::~unique_ptr
                            ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)
                             &elems.
                              super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                }
                Token::~Token((Token *)(local_b0 + 0x18));
              }
            }
          }
        }
      }
    }
  }
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parsePrecPrimary() {
        if (consume(TokenType::INTEGER)) {
            return std::make_unique<IntegerExpr>(std::stoi(m_previous.lexeme));
        }
        if (consume(TokenType::FLOAT)) {
            return std::make_unique<FloatExpr>(std::stod(m_previous.lexeme));
        }

        if (consume(TokenType::TRUE))  {
            return std::make_unique<BooleanExpr>(true);
        }
        if (consume(TokenType::FALSE)) {
            return std::make_unique<BooleanExpr>(false);
        }

        if (consume(TokenType::STRING)) {
            return std::make_unique<StringExpr>(m_previous.lexeme);
        }

        if (consume(TokenType::INTERPOLATION)) {
            return parseInterpolationExpr();
        }

        if (consume(TokenType::IDENTIFIER)) {
            return std::make_unique<SymbolExpr>(m_previous);
        }

        if (consume(TokenType::LEFT_PAREN)) {
            Token paren = m_previous;

            // Unit type ()
            if (consume(TokenType::RIGHT_PAREN)) return std::make_unique<UnitExpr>(std::move(paren));

            // Grouping (expr)
            std::unique_ptr<Expr> expr = parseExpr();
            if (consume(TokenType::RIGHT_PAREN)) return expr;

            // Tuple (expr, expr...)
            std::vector<std::unique_ptr<Expr>> elems{};
            elems.push_back(std::move(expr));
            while (consume(TokenType::COMMA)) {
                elems.push_back(parseExpr());
            }

            expect(TokenType::RIGHT_PAREN, "Expected ')' after tuple elements.");

            return std::make_unique<TupleExpr>(std::move(elems), std::move(paren));
        }

        throw errorAtCurrent("Expected expression.");
    }